

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void tcg_gen_andc_vec_mips(TCGContext_conflict3 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a,TCGv_vec b)

{
  TCGv_vec in_R9;
  
  vec_gen_op3(tcg_ctx,INDEX_op_andc_vec,(uint)r,a,b,in_R9);
  return;
}

Assistant:

void tcg_gen_andc_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a, TCGv_vec b)
{
    if (TCG_TARGET_HAS_andc_vec) {
        vec_gen_op3(tcg_ctx, INDEX_op_andc_vec, 0, r, a, b);
    } else {
        TCGv_vec t = tcg_temp_new_vec_matching(tcg_ctx, r);
        tcg_gen_not_vec(tcg_ctx, 0, t, b);
        tcg_gen_and_vec(tcg_ctx, 0, r, a, t);
        tcg_temp_free_vec(tcg_ctx, t);
    }
}